

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_link::translate
          (method_link *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  _Elt_pointer pdVar1;
  statement_var *this_00;
  const_reference pptVar2;
  _Elt_pointer pptVar3;
  tree_type<cs::token_base_*> local_30;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (statement_var *)statement_base::operator_new((statement_base *)0x30,(size_t)context);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  tree_type<cs::token_base_*>::tree_type(&local_30,(tree_type<cs::token_base_*> *)(*pptVar2 + 1));
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar1 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar3 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar3 ==
      (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar3 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_var::statement_var(this_00,&local_30,(context_t *)&local_28,true,pptVar3[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  tree_type<cs::token_base_*>::~tree_type(&local_30);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *method_link::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		return new statement_var(static_cast<token_expr *>(raw.front().at(1))->get_tree(), context, true,
		                         raw.front().back());
	}